

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O2

void __thiscall
PushPopTest_FifoOrder_Test::~PushPopTest_FifoOrder_Test(PushPopTest_FifoOrder_Test *this)

{
  PushPopTest::~PushPopTest(&this->super_PushPopTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(PushPopTest, FifoOrder) {
    std::size_t n = GetParam();
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        stdDeque.push_back(x);
    }

    ASSERT_EQ(myDeque.size(), stdDeque.size());

    auto p = std::mismatch(myDeque.begin(), myDeque.end(), stdDeque.begin());
    ASSERT_EQ(p.first, myDeque.end());

    while (!stdDeque.empty()) {
        int s = stdDeque.front();
        int m = myDeque.front();
        ASSERT_EQ(s, m);
        stdDeque.pop_front();
        myDeque.pop_front();
    }
}